

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::unregisterCore(string_view name)

{
  bool bVar1;
  byte bVar2;
  string *unaff_retaddr;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000008;
  function<bool_(const_std::shared_ptr<helics::Core>_&)> *in_stack_00000010;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000018;
  undefined6 in_stack_ffffffffffffff80;
  anon_class_8_1_898f2789 *__f;
  allocator<char> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  anon_class_8_1_898f2789 local_31 [4];
  
  __f = local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
                    (in_stack_00000008,unaff_retaddr);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT17(bVar1,CONCAT16(bVar1,in_stack_ffffffffffffff80)) ^ 0xff000000000000));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if ((bVar2 & 1) != 0) {
    std::function<bool(std::shared_ptr<helics::Core>const&)>::
    function<helics::CoreFactory::unregisterCore(std::basic_string_view<char,std::char_traits<char>>)::__0,void>
              ((function<bool_(const_std::shared_ptr<helics::Core>_&)> *)&stack0xfffffffffffffff0,
               __f);
    gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
              (in_stack_00000018,in_stack_00000010);
    std::function<bool_(const_std::shared_ptr<helics::Core>_&)>::~function
              ((function<bool_(const_std::shared_ptr<helics::Core>_&)> *)0x4fb9f4);
  }
  return;
}

Assistant:

void unregisterCore(std::string_view name)
{
    if (!searchableCores.removeObject(std::string{name})) {
        searchableCores.removeObject([&name](auto& obj) { return (obj->getIdentifier() == name); });
    }
}